

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

void * __thiscall ncnn::PoolAllocator::fastMalloc(PoolAllocator *this,size_t size)

{
  size_t *psVar1;
  pthread_mutex_t *__mutex;
  PoolAllocatorPrivate *pPVar2;
  bool bVar3;
  int iVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  void *ptr;
  _List_node_base *local_40;
  _List_node_base *local_38;
  
  pthread_mutex_lock((pthread_mutex_t *)this->d);
  p_Var7 = (_List_node_base *)&this->d->budgets;
  do {
    p_Var7 = (((_List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    __mutex = (pthread_mutex_t *)this->d;
    if (p_Var7 == (_List_node_base *)((long)__mutex + 0x58)) {
      pthread_mutex_unlock(__mutex);
      local_38 = (_List_node_base *)0x0;
      iVar4 = posix_memalign(&local_38,0x40,size + 0x40);
      if (iVar4 != 0) {
        local_38 = (_List_node_base *)0x0;
      }
      p_Var7 = local_38;
      pthread_mutex_lock((pthread_mutex_t *)&this->d->payouts_lock);
      pPVar2 = this->d;
      p_Var6 = (_List_node_base *)operator_new(0x20);
      p_Var6[1]._M_next = (_List_node_base *)size;
      p_Var6[1]._M_prev = p_Var7;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      psVar1 = &(pPVar2->payouts).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&this->d->payouts_lock);
      return p_Var7;
    }
    p_Var6 = p_Var7[1]._M_next;
    bVar3 = true;
    if ((size <= p_Var6) && ((ulong)(uint)__mutex[2].__data.__lock * (long)p_Var6 >> 8 <= size)) {
      local_40 = p_Var7[1]._M_prev;
      *(long *)((long)__mutex + 0x68) = *(long *)((long)__mutex + 0x68) + -1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var7,0x20);
      pthread_mutex_unlock((pthread_mutex_t *)this->d);
      pthread_mutex_lock((pthread_mutex_t *)&this->d->payouts_lock);
      pPVar2 = this->d;
      p_Var5 = (_List_node_base *)operator_new(0x20);
      p_Var5[1]._M_next = p_Var6;
      p_Var5[1]._M_prev = local_40;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(pPVar2->payouts).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&this->d->payouts_lock);
      bVar3 = false;
    }
  } while (bVar3);
  return local_40;
}

Assistant:

void* PoolAllocator::fastMalloc(size_t size)
{
    d->budgets_lock.lock();

    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->budgets_lock.unlock();

            d->payouts_lock.lock();

            d->payouts.push_back(std::make_pair(bs, ptr));

            d->payouts_lock.unlock();

            return ptr;
        }
    }

    d->budgets_lock.unlock();

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts_lock.lock();

    d->payouts.push_back(std::make_pair(size, ptr));

    d->payouts_lock.unlock();

    return ptr;
}